

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_8::DiskAppendableFile::~DiskAppendableFile(DiskAppendableFile *this)

{
  DiskAppendableFile *this_local;
  
  FdOutputStream::~FdOutputStream(&this->super_FdOutputStream);
  DiskHandle::~DiskHandle(&this->super_DiskHandle);
  AppendableFile::~AppendableFile(&this->super_AppendableFile);
  return;
}

Assistant:

DiskAppendableFile(AutoCloseFd&& fd)
      : DiskHandle(kj::mv(fd)),
        FdOutputStream(DiskHandle::fd.get()) {}